

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O2

void Bac_ManRemapBarbufs(Bac_Man_t *pNew,Bac_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  if ((pNew->vBuf2RootNtk).nSize == 0) {
    Vec_IntAppend(&pNew->vBuf2RootNtk,&p->vBuf2RootNtk);
    Vec_IntAppend(&pNew->vBuf2RootObj,&p->vBuf2RootObj);
    Vec_IntAppend(&pNew->vBuf2LeafNtk,&p->vBuf2LeafNtk);
    Vec_IntAppend(&pNew->vBuf2LeafObj,&p->vBuf2LeafObj);
    for (iVar3 = 0; iVar3 < (p->vBuf2LeafObj).nSize; iVar3 = iVar3 + 1) {
      iVar1 = Vec_IntEntry(&p->vBuf2LeafObj,iVar3);
      uVar2 = Vec_IntEntry(&p->vBuf2LeafNtk,iVar3);
      iVar1 = Vec_IntEntry(&p->pNtks[uVar2].vCopy,iVar1);
      Vec_IntWriteEntry(&pNew->vBuf2LeafObj,iVar3,iVar1);
    }
    for (iVar3 = 0; iVar3 < (p->vBuf2RootObj).nSize; iVar3 = iVar3 + 1) {
      iVar1 = Vec_IntEntry(&p->vBuf2RootObj,iVar3);
      uVar2 = Vec_IntEntry(&p->vBuf2RootNtk,iVar3);
      iVar1 = Vec_IntEntry(&p->pNtks[uVar2].vCopy,iVar1);
      Vec_IntWriteEntry(&pNew->vBuf2RootObj,iVar3,iVar1);
    }
    return;
  }
  __assert_fail("!Vec_IntSize(&pNew->vBuf2RootNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                ,0x131,"void Bac_ManRemapBarbufs(Bac_Man_t *, Bac_Man_t *)");
}

Assistant:

void Bac_ManRemapBarbufs( Bac_Man_t * pNew, Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk;  int Entry, i;
    //assert( Vec_IntSize(&p->vBuf2RootNtk) );
    assert( !Vec_IntSize(&pNew->vBuf2RootNtk) );
    Vec_IntAppend( &pNew->vBuf2RootNtk, &p->vBuf2RootNtk );
    Vec_IntAppend( &pNew->vBuf2RootObj, &p->vBuf2RootObj );
    Vec_IntAppend( &pNew->vBuf2LeafNtk, &p->vBuf2LeafNtk );
    Vec_IntAppend( &pNew->vBuf2LeafObj, &p->vBuf2LeafObj );
    Vec_IntForEachEntry( &p->vBuf2LeafObj, Entry, i )
    {
        pNtk = Bac_ManNtk( p, Vec_IntEntry(&p->vBuf2LeafNtk, i) );
        Vec_IntWriteEntry( &pNew->vBuf2LeafObj, i, Bac_ObjCopy(pNtk, Entry) );
    }
    Vec_IntForEachEntry( &p->vBuf2RootObj, Entry, i )
    {
        pNtk = Bac_ManNtk( p, Vec_IntEntry(&p->vBuf2RootNtk, i) );
        Vec_IntWriteEntry( &pNew->vBuf2RootObj, i, Bac_ObjCopy(pNtk, Entry) );
    }
}